

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

bool __thiscall Omega_h::InputScalar::as(InputScalar *this,int *out)

{
  uint *puVar1;
  bool bVar2;
  LL val;
  istringstream ss;
  long local_198;
  long local_190 [3];
  uint auStack_178 [24];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)&this->str,_S_in);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 & 0xffffefff;
  std::istream::_M_extract<long_long>((longlong *)local_190);
  if (((*(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18) + 8) & 7) == 2) &&
     ((int)local_198 == local_198)) {
    *out = (int)local_198;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
  std::ios_base::~ios_base(local_118);
  return bVar2;
}

Assistant:

bool InputScalar::as(int& out) const {
  std::istringstream ss(str);
  using LL = long long;
  LL val;
  ss >> std::noskipws >> val;
  if (ss.eof() && !ss.fail() && (val >= LL(std::numeric_limits<int>::min())) &&
      (val <= LL(std::numeric_limits<int>::max()))) {
    out = int(val);
    return true;
  }
  return false;
}